

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
VectorInstance::op_removeAll
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  size_type sVar2;
  undefined8 *puVar3;
  const_iterator __position;
  string *in_RDX;
  long in_RSI;
  string *in_RDI;
  int i;
  shared_ptr<Instance> instance;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_ffffffffffffff58;
  allocator *paVar4;
  shared_ptr<Instance> *in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar5;
  allocator local_61;
  shared_ptr<Instance> *local_60;
  shared_ptr<Instance> *local_58;
  shared_ptr<Instance> *local_50;
  int local_2c;
  string *in_stack_ffffffffffffffe0;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDX);
  if (sVar2 == 1) {
    __position._M_current = (shared_ptr<Instance> *)(in_RSI + 0x58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDX,0);
    get_shared_instance(in_RDX,in_stack_ffffffffffffffe0);
    local_2c = 0;
    while (iVar5 = local_2c,
          sVar2 = std::
                  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
                  size((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                        *)(in_RSI + 0x78)), iVar5 < (int)sVar2) {
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
      operator[]((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 (in_RSI + 0x78),(long)local_2c);
      bVar1 = InstanceIsEqualToComparator::operator()
                        ((InstanceIsEqualToComparator *)CONCAT44(iVar5,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff68._M_current,in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff70 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff70);
      if (bVar1) {
        in_stack_ffffffffffffff60 = (shared_ptr<Instance> *)(in_RSI + 0x78);
        local_58 = (shared_ptr<Instance> *)
                   std::
                   vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
                   begin(in_stack_ffffffffffffff58);
        local_50 = (shared_ptr<Instance> *)
                   __gnu_cxx::
                   __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                   ::operator+((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                                *)in_stack_ffffffffffffff68._M_current,
                               (difference_type)in_stack_ffffffffffffff60);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Instance>const*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>
        ::__normal_iterator<std::shared_ptr<Instance>*>
                  ((__normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                    *)in_stack_ffffffffffffff60,
                   (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                    *)in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff68 =
             std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
             erase((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *
                   )CONCAT44(iVar5,in_stack_ffffffffffffff70),__position);
        local_2c = local_2c + -1;
        local_60 = (shared_ptr<Instance> *)in_stack_ffffffffffffff68;
      }
      local_2c = local_2c + 1;
    }
    paVar4 = &local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"null",paVar4);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c1852);
    return in_RDI;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_removeAll(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    for (int i = 0; i < int(_value.size()); i++)
        if (InstanceIsEqualToComparator()(_value[i], instance)) {
            _value.erase(_value.begin() + i);
            i--;
        }
    return "null";
}